

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cpp
# Opt level: O2

string * fs_as_posix_abi_cxx11_(string_view path)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  _Bool _Var1;
  string *in_RDI;
  allocator<char> local_22;
  char local_21;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)in_RDI,&local_20,&local_22);
  _Var1 = fs_is_windows();
  if (_Var1) {
    __first._M_current = (in_RDI->_M_dataplus)._M_p;
    local_22 = (allocator<char>)0x5c;
    local_21 = '/';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(__first._M_current + in_RDI->_M_string_length),(char *)&local_22,&local_21
              );
  }
  return in_RDI;
}

Assistant:

std::string fs_as_posix(std::string_view path)
{
  std::string s(path);

  if(fs_is_windows())
    std::replace(s.begin(), s.end(), '\\', '/');

  return s;
}